

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RWNode.h
# Opt level: O2

void __thiscall dg::dda::RWNodeCall::_summarizeAnnotation(RWNodeCall *this)

{
  pointer pRVar1;
  RWNode *pRVar2;
  pointer ppRVar3;
  vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> *__range5;
  const_iterator __begin3;
  pointer pRVar4;
  const_iterator __end3;
  ulong uVar5;
  pointer ppRVar6;
  vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_> undefined;
  RWNode *uc;
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
  local_60;
  
  pRVar4 = (this->callees).
           super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->callees).
           super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (0x10 < (ulong)((long)pRVar1 - (long)pRVar4)) {
    undefined.super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    undefined.super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    undefined.super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
      uc = pRVar4->calledValue;
      if (uc != (RWNode *)0x0) {
        std::vector<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::push_back
                  (&undefined,&uc);
      }
    }
    if ((long)undefined.
              super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)undefined.
              super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>.
              _M_impl.super__Vector_impl_data._M_start == 8) {
      RWNode::Annotations::operator=
                (&(this->super_RWNode).annotations,
                 &(*undefined.
                    super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start)->annotations);
    }
    else if (8 < (ulong)((long)undefined.
                               super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)undefined.
                              super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
      DefSiteSet::intersect
                ((DefSiteSet *)&uc,
                 &((*undefined.
                     super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start)->annotations).overwrites,
                 &(undefined.
                   super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[1]->annotations).overwrites);
      for (uVar5 = 2;
          uVar5 < (ulong)((long)undefined.
                                super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)undefined.
                                super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3); uVar5 = uVar5 + 1)
      {
        DefSiteSet::intersect
                  ((DefSiteSet *)&local_60,(DefSiteSet *)&uc,
                   &(undefined.
                     super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5]->annotations).overwrites);
        std::
        _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
        ::_M_move_assign((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                          *)&uc,&local_60);
        std::
        _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
        ::~_Rb_tree(&local_60);
      }
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::operator=((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&(this->super_RWNode).annotations.overwrites,
                  (_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&uc);
      ppRVar3 = undefined.
                super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppRVar6 = undefined.
                     super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppRVar6 != ppRVar3;
          ppRVar6 = ppRVar6 + 1) {
        pRVar2 = *ppRVar6;
        DefSiteSet::add<dg::dda::DefSiteSet>
                  (&(this->super_RWNode).annotations.defs,&(pRVar2->annotations).defs);
        DefSiteSet::add<dg::dda::DefSiteSet>
                  (&(this->super_RWNode).annotations.uses,&(pRVar2->annotations).uses);
      }
      std::
      _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
      ::~_Rb_tree((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,_dg::dda::GenericDefSite<dg::dda::RWNode>,_std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::less<dg::dda::GenericDefSite<dg::dda::RWNode>_>,_std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>_>_>
                   *)&uc);
    }
    std::_Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>::
    ~_Vector_base(&undefined.
                   super__Vector_base<const_dg::dda::RWNode_*,_std::allocator<const_dg::dda::RWNode_*>_>
                 );
  }
  this->_annotations_summarized = true;
  return;
}

Assistant:

void _summarizeAnnotation() const {
        if (callees.size() > 1) {
            std::vector<const RWNode *> undefined;
            for (const auto &cv : callees) {
                if (const auto *uc = cv.getCalledValue()) {
                    undefined.push_back(uc);
                }
            }

            if (undefined.size() == 1) {
                annotations = undefined[0]->annotations;
            } else if (undefined.size() > 1) {
                auto kills = undefined[0]->annotations.overwrites.intersect(
                        undefined[1]->annotations.overwrites);
                for (size_t i = 2; i < undefined.size(); ++i) {
                    kills = kills.intersect(
                            undefined[i]->annotations.overwrites);
                }

                annotations.overwrites = kills;
                for (const auto *u : undefined) {
                    annotations.defs.add(u->annotations.defs);
                    annotations.uses.add(u->annotations.uses);
                }
            }
        }
        _annotations_summarized = true;
    }